

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  bool bVar5;
  pointer ppTVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  pointer ppEVar13;
  long lVar14;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar15;
  timeval now;
  timeval local_58;
  uint local_44;
  int local_40;
  uint local_3c;
  long local_38;
  
  if (DAT_001c7ba8 == g_argvs_abi_cxx11_) {
    GTestLog::GTestLog((GTestLog *)&local_58,GTEST_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/lib/gtest/googletest/src/gtest.cc"
                       ,0x11e2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\nThis test program did NOT call ::testing::InitGoogleTest before calling RUN_ALL_TESTS().  Please fix it."
               ,0x69);
    GTestLog::~GTestLog((GTestLog *)&local_58);
    bVar9 = 0;
  }
  else {
    bVar9 = 1;
    if (g_help_flag == '\0') {
      PostFlagParsingInit(this);
      WriteToShardStatusFileIfNeeded();
      pIVar1 = (this->internal_run_death_test_flag_).ptr_;
      bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                          pIVar1 != (InternalRunDeathTestFlag *)0x0);
      local_40 = FilterTests(this,(uint)!bVar5);
      if (FLAGS_gtest_list_tests == '\x01') {
        ListTestsMatchingFilter(this);
      }
      else {
        iVar7 = 0;
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar7 = FLAGS_gtest_random_seed;
          if (FLAGS_gtest_random_seed == 0) {
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            iVar7 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),8) >> 7) -
                    (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),0xc) >> 0x1f)) +
                    (int)local_58.tv_sec * 1000;
          }
          iVar7 = (iVar7 - 1U) % 99999 + 1;
        }
        this->random_seed_ = iVar7;
        pTVar2 = (this->listeners_).repeater_;
        gettimeofday(&local_58,(__timezone_ptr_t)0x0);
        this->start_timestamp_ =
             local_58.tv_usec / 1000 + CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec) * 1000;
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2);
        uVar11 = 1;
        if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
          uVar11 = FLAGS_gtest_repeat;
        }
        if (uVar11 == 0) {
          bVar9 = 1;
        }
        else {
          uVar12 = 0;
          uVar10 = 0;
          local_44 = uVar11;
          do {
            ppTVar3 = (this->test_cases_).
                      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_3c = uVar10;
            for (ppTVar6 = (this->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppTVar6 != ppTVar3;
                ppTVar6 = ppTVar6 + 1) {
              TestCase::ClearResult(*ppTVar6);
            }
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),8);
            local_38 = CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec);
            if (local_40 < 1) {
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar12);
            }
            else {
              if (FLAGS_gtest_shuffle == '\x01') {
                (this->random_).state_ = this->random_seed_;
                ShuffleTests(this);
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar12);
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
              ppEVar15 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (ppEVar13 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppEVar13 != ppEVar15;
                  ppEVar13 = ppEVar13 + 1) {
                (**(code **)(*(long *)*ppEVar13 + 0x10))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
              bVar5 = Test::HasFatalFailure();
              if ((!bVar5) &&
                 (ppTVar6 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 0 < (int)((ulong)((long)(this->test_cases_).
                                         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6)
                          >> 3))) {
                lVar14 = 0;
                do {
                  piVar4 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar11 = 0xffffffff;
                  if (lVar14 < (int)((ulong)((long)(this->test_case_indices_).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar4) >> 2)) {
                    uVar11 = piVar4[lVar14];
                  }
                  TestCase::Run(ppTVar6[uVar11]);
                  lVar14 = lVar14 + 1;
                  ppTVar6 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar14 < (int)((ulong)((long)(this->test_cases_).
                                                                                                            
                                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppTVar6) >> 3));
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xb])
                        (pTVar2,this->parent_);
              ppEVar13 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              for (ppEVar15 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish; ppEVar15 != ppEVar13;
                  ppEVar15 = ppEVar15 + -1) {
                (**(code **)(*(long *)ppEVar15[-1] + 0x18))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2);
            }
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            this->elapsed_time_ =
                 (CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec) - local_38) * 1000 +
                 local_58.tv_usec / 1000 + ((lVar8 >> 7) - (lVar8 >> 0x3f));
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])
                      (pTVar2,this->parent_,uVar12);
            bVar5 = Passed(this);
            uVar10 = local_3c & 0xff;
            if (!bVar5) {
              uVar10 = 1;
            }
            UnshuffleTests(this);
            if (FLAGS_gtest_shuffle == '\x01') {
              iVar7 = GetNextRandomSeed(this->random_seed_);
              this->random_seed_ = iVar7;
            }
            uVar11 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar11;
          } while (uVar11 != local_44 || (int)local_44 < 0);
          bVar9 = (byte)uVar10 ^ 1;
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
      }
    }
  }
  return (bool)(bVar9 & 1);
}

Assistant:

void SplitString(const ::std::string& str, char delimiter,
                 ::std::vector< ::std::string>* dest) {
  ::std::vector< ::std::string> parsed;
  ::std::string::size_type pos = 0;
  while (::testing::internal::AlwaysTrue()) {
    const ::std::string::size_type colon = str.find(delimiter, pos);
    if (colon == ::std::string::npos) {
      parsed.push_back(str.substr(pos));
      break;
    } else {
      parsed.push_back(str.substr(pos, colon - pos));
      pos = colon + 1;
    }
  }
  dest->swap(parsed);
}